

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

_Bool mpack_expect_bool(mpack_reader_t *reader)

{
  _Bool _Var1;
  byte *pbVar2;
  byte bVar3;
  
  bVar3 = 0;
  if (reader->error != mpack_ok) goto LAB_00108172;
  pbVar2 = (byte *)reader->data;
  if ((byte *)reader->end == pbVar2) {
    _Var1 = mpack_reader_ensure_straddle(reader,1);
    bVar3 = 0;
    if (_Var1) {
      pbVar2 = (byte *)reader->data;
      goto LAB_001081a3;
    }
  }
  else {
LAB_001081a3:
    bVar3 = *pbVar2;
    reader->data = (char *)(pbVar2 + 1);
    if ((bVar3 & 0xfe) == 0xc2) goto LAB_00108172;
  }
  if (reader->error == mpack_ok) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
LAB_00108172:
  return (_Bool)(bVar3 & 1);
}

Assistant:

bool mpack_expect_bool(mpack_reader_t* reader) {
    uint8_t type = mpack_expect_type_byte(reader);
    if ((type & ~1) != 0xc2)
        mpack_reader_flag_error(reader, mpack_error_type);
    return (bool)(type & 1);
}